

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

char * fio_sha1_result(fio_sha1_s *s)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  uint uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  uVar26 = (uint)s->length & 0x3f;
  uVar27 = (ulong)uVar26;
  if (uVar27 < 0x38) {
    if (uVar26 == 0x37) {
      s->buffer[0x37] = 0x80;
    }
    else {
      memcpy(s->buffer + uVar27,sha1_padding,0x38 - uVar27);
    }
  }
  else {
    memcpy(s->buffer + uVar27,sha1_padding,0x40 - uVar27);
    fio_sha1_perform_all_rounds(s,s->buffer);
    s->buffer[0x20] = '\0';
    s->buffer[0x21] = '\0';
    s->buffer[0x22] = '\0';
    s->buffer[0x23] = '\0';
    s->buffer[0x24] = '\0';
    s->buffer[0x25] = '\0';
    s->buffer[0x26] = '\0';
    s->buffer[0x27] = '\0';
    s->buffer[0x28] = '\0';
    s->buffer[0x29] = '\0';
    s->buffer[0x2a] = '\0';
    s->buffer[0x2b] = '\0';
    s->buffer[0x2c] = '\0';
    s->buffer[0x2d] = '\0';
    s->buffer[0x2e] = '\0';
    s->buffer[0x2f] = '\0';
    s->buffer[0x10] = '\0';
    s->buffer[0x11] = '\0';
    s->buffer[0x12] = '\0';
    s->buffer[0x13] = '\0';
    s->buffer[0x14] = '\0';
    s->buffer[0x15] = '\0';
    s->buffer[0x16] = '\0';
    s->buffer[0x17] = '\0';
    s->buffer[0x18] = '\0';
    s->buffer[0x19] = '\0';
    s->buffer[0x1a] = '\0';
    s->buffer[0x1b] = '\0';
    s->buffer[0x1c] = '\0';
    s->buffer[0x1d] = '\0';
    s->buffer[0x1e] = '\0';
    s->buffer[0x1f] = '\0';
    s->buffer[0] = '\0';
    s->buffer[1] = '\0';
    s->buffer[2] = '\0';
    s->buffer[3] = '\0';
    s->buffer[4] = '\0';
    s->buffer[5] = '\0';
    s->buffer[6] = '\0';
    s->buffer[7] = '\0';
    s->buffer[8] = '\0';
    s->buffer[9] = '\0';
    s->buffer[10] = '\0';
    s->buffer[0xb] = '\0';
    s->buffer[0xc] = '\0';
    s->buffer[0xd] = '\0';
    s->buffer[0xe] = '\0';
    s->buffer[0xf] = '\0';
    s->buffer[0x30] = '\0';
    s->buffer[0x31] = '\0';
    s->buffer[0x32] = '\0';
    s->buffer[0x33] = '\0';
    s->buffer[0x34] = '\0';
    s->buffer[0x35] = '\0';
    s->buffer[0x36] = '\0';
    s->buffer[0x37] = '\0';
  }
  uVar27 = s->length << 3;
  *(ulong *)(s->buffer + 0x38) =
       uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 | (uVar27 & 0xff0000000000) >> 0x18 |
       (uVar27 & 0xff00000000) >> 8 | (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
       (uVar27 & 0xff00) << 0x28 | s->length << 0x3b;
  fio_sha1_perform_all_rounds(s,s->buffer);
  auVar28 = *(undefined1 (*) [16])&s->digest;
  auVar30[1] = 0;
  auVar30[0] = auVar28[8];
  auVar30[2] = auVar28[9];
  auVar30[3] = 0;
  auVar30[4] = auVar28[10];
  auVar30[5] = 0;
  auVar30[6] = auVar28[0xb];
  auVar30[7] = 0;
  auVar30[8] = auVar28[0xc];
  auVar30[9] = 0;
  auVar30[10] = auVar28[0xd];
  auVar30[0xb] = 0;
  auVar30[0xc] = auVar28[0xe];
  auVar30[0xd] = 0;
  auVar30[0xe] = auVar28[0xf];
  auVar30[0xf] = 0;
  auVar29 = pshuflw(auVar30,auVar30,0x1b);
  auVar30 = pshufhw(auVar29,auVar29,0x1b);
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar28._0_13_;
  auVar17[0xe] = auVar28[7];
  auVar18[0xc] = auVar28[6];
  auVar18._0_12_ = auVar28._0_12_;
  auVar18._13_2_ = auVar17._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar28._0_11_;
  auVar19._12_3_ = auVar18._12_3_;
  auVar20[10] = auVar28[5];
  auVar20._0_10_ = auVar28._0_10_;
  auVar20._11_4_ = auVar19._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar28._0_9_;
  auVar21._10_5_ = auVar20._10_5_;
  auVar22[8] = auVar28[4];
  auVar22._0_8_ = auVar28._0_8_;
  auVar22._9_6_ = auVar21._9_6_;
  auVar23._7_8_ = 0;
  auVar23._0_7_ = auVar22._8_7_;
  auVar24._1_8_ = SUB158(auVar23 << 0x40,7);
  auVar24[0] = auVar28[3];
  auVar24._9_6_ = 0;
  auVar25._1_10_ = SUB1510(auVar24 << 0x30,5);
  auVar25[0] = auVar28[2];
  auVar25._11_4_ = 0;
  auVar29._3_12_ = SUB1512(auVar25 << 0x20,3);
  auVar29[2] = auVar28[1];
  auVar29[0] = auVar28[0];
  auVar29[1] = 0;
  auVar29[0xf] = 0;
  auVar28 = pshuflw(auVar29,auVar29,0x1b);
  auVar28 = pshufhw(auVar28,auVar28,0x1b);
  sVar1 = auVar28._0_2_;
  sVar2 = auVar28._2_2_;
  sVar3 = auVar28._4_2_;
  sVar4 = auVar28._6_2_;
  sVar5 = auVar28._8_2_;
  sVar6 = auVar28._10_2_;
  sVar7 = auVar28._12_2_;
  sVar8 = auVar28._14_2_;
  sVar9 = auVar30._0_2_;
  sVar10 = auVar30._2_2_;
  sVar11 = auVar30._4_2_;
  sVar12 = auVar30._6_2_;
  sVar13 = auVar30._8_2_;
  sVar14 = auVar30._10_2_;
  sVar15 = auVar30._12_2_;
  sVar16 = auVar30._14_2_;
  (s->digest).str[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar28[0] - (0xff < sVar1);
  (s->digest).str[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar28[2] - (0xff < sVar2);
  (s->digest).str[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar28[4] - (0xff < sVar3);
  (s->digest).str[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar28[6] - (0xff < sVar4);
  (s->digest).str[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar28[8] - (0xff < sVar5);
  (s->digest).str[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar28[10] - (0xff < sVar6);
  (s->digest).str[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar28[0xc] - (0xff < sVar7);
  (s->digest).str[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar28[0xe] - (0xff < sVar8);
  (s->digest).str[8] = (0 < sVar9) * (sVar9 < 0x100) * auVar30[0] - (0xff < sVar9);
  (s->digest).str[9] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[2] - (0xff < sVar10);
  (s->digest).str[10] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[4] - (0xff < sVar11);
  (s->digest).str[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[6] - (0xff < sVar12);
  (s->digest).str[0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[8] - (0xff < sVar13);
  (s->digest).str[0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar30[10] - (0xff < sVar14);
  (s->digest).str[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar30[0xc] - (0xff < sVar15);
  (s->digest).str[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar30[0xe] - (0xff < sVar16);
  uVar26 = (s->digest).i[4];
  (s->digest).i[4] =
       uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  return (char *)&s->digest;
}

Assistant:

char *fio_sha1_result(fio_sha1_s *s) {
  size_t in_buffer = s->length & 63;
  if (in_buffer > 55) {
    memcpy(s->buffer + in_buffer, sha1_padding, 64 - in_buffer);
    fio_sha1_perform_all_rounds(s, s->buffer);
    memcpy(s->buffer, sha1_padding + 1, 56);
  } else if (in_buffer != 55) {
    memcpy(s->buffer + in_buffer, sha1_padding, 56 - in_buffer);
  } else {
    s->buffer[55] = sha1_padding[0];
  }
  /* store the length in BITS - alignment should be promised by struct */
  /* this must the number in BITS, encoded as a BIG ENDIAN 64 bit number */
  uint64_t *len = (uint64_t *)(s->buffer + 56);
  *len = s->length << 3;
  *len = fio_lton64(*len);
  fio_sha1_perform_all_rounds(s, s->buffer);

  /* change back to little endian */
  s->digest.i[0] = fio_ntol32(s->digest.i[0]);
  s->digest.i[1] = fio_ntol32(s->digest.i[1]);
  s->digest.i[2] = fio_ntol32(s->digest.i[2]);
  s->digest.i[3] = fio_ntol32(s->digest.i[3]);
  s->digest.i[4] = fio_ntol32(s->digest.i[4]);

  return (char *)s->digest.str;
}